

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setFormatWidth(DecimalFormat *this,int32_t width)

{
  DecimalFormatProperties *pDVar1;
  int32_t width_local;
  DecimalFormat *this_local;
  
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  if (width != pDVar1->formatWidth) {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->formatWidth = width;
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setFormatWidth(int32_t width) {
    if (width == fields->properties->formatWidth) { return; }
    fields->properties->formatWidth = width;
    touchNoError();
}